

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsLoad::Read<tcu::Vector<unsigned_int,4>>
          (BasicAllFormatsLoad *this,GLenum internalformat,Vector<unsigned_int,_4> *value,
          Vector<unsigned_int,_4> *expected_value)

{
  uint v0;
  CallLogWrapper *this_00;
  Vector<unsigned_int,_4> *__value;
  bool bVar1;
  GLuint program;
  GLint location;
  ostream *poVar2;
  GLenum e;
  GLenum e_00;
  undefined4 in_register_00000034;
  int h;
  vec4 *expected;
  uint unit;
  bool bVar3;
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  GLuint texture;
  undefined8 local_228;
  undefined2 local_220;
  undefined6 uStack_21e;
  Vector<unsigned_int,_4> *local_210;
  long *local_208;
  long local_1f8 [2];
  char *local_1e8;
  undefined8 local_1e0;
  undefined2 local_1d8;
  undefined6 uStack_1d6;
  char *local_1c8;
  undefined8 local_1c0;
  undefined2 local_1b8;
  undefined6 uStack_1b6;
  ostringstream os;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&os,"#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",
             0x40);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            ((string *)&data,(void *)CONCAT44(in_register_00000034,internalformat),e);
  local_210 = value;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (&os.super_basic_ostream<char,_std::char_traits<char>_>,
                      (char *)data.
                              super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                      (long)data.
                            super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") readonly uniform ",0x13);
  local_220 = 0x75;
  local_228 = 1;
  _texture = (char *)&local_220;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_220,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"image2D g_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  ",
             0x49);
  local_1b8 = 0x75;
  local_1c0 = 1;
  local_1c8 = (char *)&local_1b8;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1b8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"vec4 v = imageLoad(g_image, coord);\n  if (v != ",0x2f);
  local_1d8 = 0x75;
  local_1e0 = 1;
  local_1e8 = (char *)&local_1d8;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1d8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"vec4",4);
  poVar2 = tcu::operator<<(poVar2,expected_value);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             ") o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  else o_color = vec4(0.0, 1.0, 0.0, 1.0);\n}",
             0x52);
  if (local_1e8 != (char *)&local_1d8) {
    operator_delete(local_1e8,CONCAT62(uStack_1d6,local_1d8) + 1);
  }
  if (local_1c8 != (char *)&local_1b8) {
    operator_delete(local_1c8,CONCAT62(uStack_1b6,local_1b8) + 1);
  }
  if (_texture != (char *)&local_220) {
    operator_delete(_texture,CONCAT62(uStack_21e,local_220) + 1);
  }
  __value = local_210;
  if (data.
      super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&data.
                super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(data.
                                   super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::ios_base::~ios_base
            ((ios_base *)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  program = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                      ((ShaderImageLoadStoreBase *)this,
                       "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_208,(bool *)0x0);
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::vector
            (&data,0x100,__value,(allocator_type *)&os);
  this_00 = (CallLogWrapper *)(this + 8);
  glu::CallLogWrapper::glGenTextures(this_00,1,&texture);
  bVar3 = false;
  unit = 0;
  while( true ) {
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,0,internalformat,0x10,0x10,0,0x8d99,0x1405,
               data.
               super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glUseProgram(this_00,program);
    h = 0;
    expected = (vec4 *)0x0;
    glu::CallLogWrapper::glBindImageTexture(this_00,unit,texture,0,'\0',0,35000,internalformat);
    glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(this + 0x28));
    glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
    os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)0x3f80000000000000;
    os.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0x3f80000000000000;
    bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ValidateReadBuffer
                      ((ShaderImageLoadStoreBase *)this,0x10,0x10,(int)&os,h,expected);
    if (!bVar1) {
      glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
      ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                ((string *)&os,(void *)CONCAT44(in_register_00000034,internalformat),e_00);
      gl4cts::anon_unknown_0::Output
                ("Bad load value. Format is: %s. Unit is: %d.\n",
                 os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                 (ulong)unit);
      if (os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        os.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      goto LAB_0098de7d;
    }
    if (unit == 7) break;
    location = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g_image");
    v0 = unit + 1;
    glu::CallLogWrapper::glUniform1i(this_00,location,v0);
    bVar3 = 6 < unit;
    unit = v0;
    if (v0 == 8) {
LAB_0098de57:
      glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
LAB_0098de7d:
      if (data.
          super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(data.
                        super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)data.
                              super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)data.
                              super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return bVar3;
    }
  }
  bVar3 = true;
  goto LAB_0098de57;
}

Assistant:

bool Read(GLenum internalformat, const T& value, const T& expected_value)
	{
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint   program = BuildProgram(src_vs, NULL, NULL, NULL, GenFS(internalformat, expected_value).c_str());
		const int	  kSize   = 16;
		std::vector<T> data(kSize * kSize, value);
		GLuint		   texture;
		glGenTextures(1, &texture);

		for (GLuint unit = 0; unit < 8; ++unit)
		{
			glBindTexture(GL_TEXTURE_2D, texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
			glBindTexture(GL_TEXTURE_2D, 0);

			glViewport(0, 0, kSize, kSize);
			glClear(GL_COLOR_BUFFER_BIT);
			glUseProgram(program);
			glBindImageTexture(unit, texture, 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
			glBindVertexArray(m_vao);
			glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

			if (!ValidateReadBuffer(0, 0, kSize, kSize, vec4(0, 1, 0, 1)))
			{
				glDeleteTextures(1, &texture);
				glUseProgram(0);
				glDeleteProgram(program);
				Output("Bad load value. Format is: %s. Unit is: %d.\n", FormatEnumToString(internalformat).c_str(),
					   unit);
				return false;
			}

			if (unit < 7)
			{
				glUniform1i(glGetUniformLocation(program, "g_image"), static_cast<GLint>(unit + 1));
			}
		}

		glDeleteTextures(1, &texture);
		glUseProgram(0);
		glDeleteProgram(program);

		return true;
	}